

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.cpp
# Opt level: O1

void __thiscall List<Observer_*>::RemoveAt(List<Observer_*> *this,long index)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if ((index < 0) || (*(long *)(this + 0x10) <= index)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Throw RangeException\n",0x15);
  }
  lVar2 = *(long *)(this + 0x10);
  lVar1 = lVar2 + -1;
  if (index < lVar1) {
    lVar3 = index + 1;
    do {
      *(undefined8 *)(*(long *)this + -8 + lVar3 * 8) = *(undefined8 *)(*(long *)this + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  *(long *)(this + 0x10) = lVar1;
  return;
}

Assistant:

void List<Item>::RemoveAt(long index) {
    if (index < 0 || index >= Count())
        std::cout << "Throw RangeException\n";
    for (long i = index; i < Count()-1; i++)
        _items[i] = _items[i+1];
    _count--;
}